

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O3

void duckdb::AddCodepoint(int32_t codepoint,LikeString *ret,bool contains)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong in_RAX;
  ulong uVar4;
  int iVar5;
  int sz;
  char utf8_str [4];
  undefined8 local_38;
  
  local_38 = in_RAX & 0xffffffff00000000;
  bVar2 = Utf8Proc::CodepointToUtf8(codepoint,(int *)&local_38,(char *)((long)&local_38 + 4));
  if (bVar2) {
    if ((int)local_38 != 0) {
      uVar4 = 0;
      iVar5 = (int)local_38;
      do {
        bVar1 = *(byte *)((long)&local_38 + uVar4 + 4);
        iVar3 = iscntrl((uint)bVar1);
        if ((iVar3 == 0) && ((contains || ((bVar1 != 0x5f && (bVar1 != 0x25)))))) {
          ::std::__cxx11::string::push_back((char)ret + '\b');
          iVar5 = (int)local_38;
        }
        else {
          ret->exists = false;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(long)iVar5);
    }
  }
  else {
    ret->exists = false;
  }
  return;
}

Assistant:

static void AddCodepoint(int32_t codepoint, LikeString &ret, bool contains) {
	int sz = 0;
	char utf8_str[4];
	if (!Utf8Proc::CodepointToUtf8(codepoint, sz, utf8_str)) {
		// invalid codepoint
		ret.exists = false;
		return;
	}
	for (idx_t i = 0; i < idx_t(sz); i++) {
		AddCharacter(utf8_str[i], ret, contains);
	}
}